

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

char * getstr(identval *v,int type)

{
  char *pcVar1;
  
  pcVar1 = "";
  switch(type) {
  case 1:
    pcVar1 = intstr((v->field_0).i);
    return pcVar1;
  case 2:
    pcVar1 = floatstr((v->field_0).f);
    return pcVar1;
  case 3:
  case 6:
    pcVar1 = (v->field_0).s;
  }
  return pcVar1;
}

Assistant:

static inline const char *getstr(const identval &v, int type) 
{
    switch(type)
    {
        case VAL_STR: case VAL_MACRO: return v.s;
        case VAL_INT: return intstr(v.i);
        case VAL_FLOAT: return floatstr(v.f);
        default: return "";
    }
}